

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O3

void __thiscall
Js::EquivalentTypeSet::SetType(EquivalentTypeSet *this,uint16 index,JITTypeHolder type)

{
  JITTypeHolderBase<Memory::Recycler> *addr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->count <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                ,0x19,"(index < this->count)","index < this->count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  addr = (this->types).ptr + index;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->t).ptr = type.t;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void EquivalentTypeSet::SetType(uint16 index, JITTypeHolder type)
{
    Assert(index < this->count);
    this->types[index] = type;
}